

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

bool absl::lts_20250127::ParseTime
               (string_view format,string_view input,TimeZone tz,Time *time,string *err)

{
  string_view text;
  TimeZone TVar1;
  size_t sVar2;
  bool bVar3;
  Duration DVar4;
  time_zone local_130;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  byte local_d5;
  bool b;
  undefined1 local_c8 [8];
  cctz_parts parts;
  string error;
  string_view tail;
  Literal *lit;
  Literal *__end2;
  Literal *__begin2;
  Literal (*__range2) [2];
  Duration *pDStack_40;
  anon_class_1_0_00000001 strip_leading_space;
  Time *time_local;
  TimeZone tz_local;
  string_view input_local;
  string_view format_local;
  
  input_local._M_len = (size_t)input._M_str;
  tz_local.cz_.impl_ = (time_zone)input._M_len;
  input_local._M_str = (char *)format._M_len;
  pDStack_40 = &time->rep_;
  time_local = (Time *)tz.cz_.impl_;
  ParseTime::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(string_view *)&tz_local);
  __end2 = ParseTime::literals;
  do {
    sVar2 = input_local._M_len;
    TVar1.cz_.impl_ = tz_local.cz_.impl_;
    if (__end2 == (Literal *)&log_internal::(anonymous_namespace)::symbolize_stack_trace) {
      std::__cxx11::string::string((string *)&parts.fem);
      anon_unknown_6::cctz_parts::cctz_parts((cctz_parts *)local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_f8,
                 (basic_string_view<char,_std::char_traits<char>_> *)&input_local._M_str,&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_120,(basic_string_view<char,_std::char_traits<char>_> *)&tz_local,
                 &local_121);
      local_130 = TimeZone::operator_cast_to_time_zone((TimeZone *)&time_local);
      bVar3 = time_internal::cctz::detail::parse
                        (&local_f8,&local_120,&local_130,(time_point<seconds> *)local_c8,
                         (femtoseconds *)&parts,(string *)&parts.fem);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      local_d5 = bVar3;
      if (bVar3) {
        DVar4 = (Duration)anon_unknown_6::Join((cctz_parts *)local_c8);
        *pDStack_40 = DVar4;
      }
      else if (err != (string *)0x0) {
        std::__cxx11::string::operator=((string *)err,(string *)&parts.fem);
      }
      bVar3 = (bool)(local_d5 & 1);
      std::__cxx11::string::~string((string *)&parts.fem);
      return bVar3;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&tail._M_str,__end2->name,
               __end2->size);
    text._M_str = (char *)sVar2;
    text._M_len = (size_t)TVar1.cz_.impl_;
    bVar3 = StartsWith(text,stack0xffffffffffffff78);
    if (bVar3) {
      error.field_2._8_8_ = tz_local.cz_.impl_;
      tail._M_len = input_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)((long)&error.field_2 + 8),
                 __end2->size);
      ParseTime::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&__range2 + 7),
                 (string_view *)((long)&error.field_2 + 8));
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&error.field_2 + 8));
      if (bVar3) {
        ((Duration *)&pDStack_40->rep_hi_)->rep_hi_ = (__end2->value).rep_.rep_hi_;
        pDStack_40->rep_lo_ = (__end2->value).rep_.rep_lo_;
        return true;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

bool ParseTime(absl::string_view format, absl::string_view input,
               absl::TimeZone tz, absl::Time* time, std::string* err) {
  auto strip_leading_space = [](absl::string_view* sv) {
    while (!sv->empty()) {
      if (!std::isspace(sv->front())) return;
      sv->remove_prefix(1);
    }
  };

  // Portable toolchains means we don't get nice constexpr here.
  struct Literal {
    const char* name;
    size_t size;
    absl::Time value;
  };
  static Literal literals[] = {
      {kInfiniteFutureStr, strlen(kInfiniteFutureStr), InfiniteFuture()},
      {kInfinitePastStr, strlen(kInfinitePastStr), InfinitePast()},
  };
  strip_leading_space(&input);
  for (const auto& lit : literals) {
    if (absl::StartsWith(input, absl::string_view(lit.name, lit.size))) {
      absl::string_view tail = input;
      tail.remove_prefix(lit.size);
      strip_leading_space(&tail);
      if (tail.empty()) {
        *time = lit.value;
        return true;
      }
    }
  }

  std::string error;
  cctz_parts parts;
  const bool b =
      cctz::detail::parse(std::string(format), std::string(input),
                          cctz::time_zone(tz), &parts.sec, &parts.fem, &error);
  if (b) {
    *time = Join(parts);
  } else if (err != nullptr) {
    *err = std::move(error);
  }
  return b;
}